

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void google::protobuf::compiler::cxx::anon_unknown_0::PrintFieldComment
               (Printer *printer,FieldDescriptor *field)

{
  string local_50;
  string def;
  
  FieldDescriptor::DebugString_abi_cxx11_(&def,field);
  std::__cxx11::string::find((char)&def,10);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&def);
  io::Printer::Print(printer,"// $def$\n","def",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&def);
  return;
}

Assistant:

void PrintFieldComment(io::Printer* printer, const FieldDescriptor* field) {
  // Print the field's proto-syntax definition as a comment.  We don't want to
  // print group bodies so we cut off after the first line.
  string def = field->DebugString();
  printer->Print("// $def$\n",
    "def", def.substr(0, def.find_first_of('\n')));
}